

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall
mjs::source_file::source_file
          (source_file *this,wstring_view *filename,wstring_view *text,version ver)

{
  wstring_view *s;
  allocator<wchar_t> local_6a;
  byte local_69;
  wstring local_68;
  wstring_view local_48 [2];
  allocator<wchar_t> local_25;
  version local_24;
  wstring_view *pwStack_20;
  version ver_local;
  wstring_view *text_local;
  wstring_view *filename_local;
  source_file *this_local;
  
  this->ver_ = ver;
  local_24 = ver;
  pwStack_20 = text;
  text_local = filename;
  filename_local = (wstring_view *)this;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)&this->filename_,filename,&local_25);
  std::allocator<wchar_t>::~allocator(&local_25);
  local_69 = 0;
  if (local_24 == es3) {
    strip_format_control_characters_abi_cxx11_(&local_68,(mjs *)pwStack_20,s);
    local_69 = 1;
    local_48[0] = (wstring_view)
                  std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_68);
  }
  else {
    local_48[0] = *pwStack_20;
  }
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)&this->text_,local_48,&local_6a);
  std::allocator<wchar_t>::~allocator(&local_6a);
  if ((local_69 & 1) != 0) {
    std::__cxx11::wstring::~wstring((wstring *)&local_68);
  }
  return;
}

Assistant:

explicit source_file(const std::wstring_view& filename, const std::wstring_view& text, version ver)
        : ver_(ver)
        , filename_(filename)
        , text_(ver == version::es3 ? strip_format_control_characters(text) : text) {
    }